

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O0

Flow __thiscall Dinic::getFlow(Dinic *this,int _S,int _T)

{
  bool bVar1;
  Flow FVar2;
  ll cur;
  int *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  reference local_40;
  Edge *x;
  iterator __end1;
  iterator __begin1;
  vector<Edge,_std::allocator<Edge>_> *__range1;
  Flow res;
  int _T_local;
  int _S_local;
  Dinic *this_local;
  
  this->S = _S;
  this->T = _T;
  __range1 = (vector<Edge,_std::allocator<Edge>_> *)0x0;
  __end1 = std::vector<Edge,_std::allocator<Edge>_>::begin(&this->e);
  x = (Edge *)std::vector<Edge,_std::allocator<Edge>_>::end(&this->e);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                     *)&x), bVar1) {
    local_40 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
               operator*(&__end1);
    local_40->flow = 0;
    __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::operator++
              (&__end1);
  }
  while (bVar1 = levels(this), bVar1) {
    local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->pt);
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->pt);
    cur._4_4_ = 0;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (local_48,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_50,
               (int *)((long)&cur + 4));
    while (FVar2 = blocking(this,this->S,1000000000000000), FVar2 != 0) {
      __range1 = (vector<Edge,_std::allocator<Edge>_> *)
                 ((long)&(__range1->super__Vector_base<Edge,_std::allocator<Edge>_>)._M_impl.
                         super__Vector_impl_data._M_start + FVar2);
    }
  }
  return (Flow)__range1;
}

Assistant:

Flow getFlow(int _S, int _T) {
        S = _S, T = _T;
        Flow res = 0;
        for (auto &x : e) x.flow = 0;
        while (levels()) {
            fill(pt.begin(), pt.end(), 0);
            while (ll cur = blocking(S, INF))
                res += cur;
        }
        return res;
    }